

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cc
# Opt level: O2

bool flow::lang::TokenTraits::isUnaryOp(Token t)

{
  return (bool)((byte)(0x301000000000 >> ((byte)t & 0x3f)) & t < BitOr);
}

Assistant:

bool TokenTraits::isUnaryOp(Token t) {
  // token Plus and Minus can be both, unary and binary
  switch (t) {
    //case Token::Plus:
    case Token::Minus:
    case Token::Not:
    case Token::BitNot:
      return true;
    default:
      return false;
  }
}